

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O3

void __thiscall Reset_takeReset_Test::~Reset_takeReset_Test(Reset_takeReset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, takeReset)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Add r to c.
    EXPECT_TRUE(c->addReset(r));
    EXPECT_EQ(size_t(1), c->resetCount());

    // Retrieve r by index.
    auto taken_r = c->takeReset(0);
    EXPECT_EQ(r, taken_r);
    EXPECT_EQ(nullptr, r->parent());
    EXPECT_EQ(nullptr, taken_r->parent());
    EXPECT_EQ(size_t(0), c->resetCount());
}